

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::prepareProgram
          (FunctionalTest20_21 *this,program **programs,bool is_separable)

{
  GLuint GVar1;
  uint local_4c;
  GLchar *pGStack_48;
  GLuint i;
  GLchar *fragmenty_shader_code;
  GLchar *geometry_shader_code;
  GLchar *tesselation_evaluation_shader_code;
  GLchar *tesselation_control_shader_code;
  GLchar *vertex_shader_code;
  program **pppStack_18;
  bool is_separable_local;
  program **programs_local;
  FunctionalTest20_21 *this_local;
  
  vertex_shader_code._7_1_ = is_separable;
  pppStack_18 = programs;
  programs_local = (program **)this;
  getShaders(this,&tesselation_control_shader_code,&tesselation_evaluation_shader_code,
             &geometry_shader_code,&fragmenty_shader_code,&stack0xffffffffffffffb8);
  if ((vertex_shader_code._7_1_ & 1) == 0) {
    Utils::program::build
              (*pppStack_18,(GLchar *)0x0,pGStack_48,fragmenty_shader_code,
               tesselation_evaluation_shader_code,geometry_shader_code,
               tesselation_control_shader_code,(GLchar **)0x0,0,false);
    pppStack_18[1] = *pppStack_18;
    pppStack_18[2] = *pppStack_18;
    pppStack_18[3] = *pppStack_18;
    pppStack_18[4] = *pppStack_18;
  }
  else {
    Utils::program::build
              (*pppStack_18,(GLchar *)0x0,pGStack_48,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               (GLchar *)0x0,(GLchar **)0x0,0,true);
    Utils::program::build
              (pppStack_18[1],(GLchar *)0x0,(GLchar *)0x0,fragmenty_shader_code,(GLchar *)0x0,
               (GLchar *)0x0,(GLchar *)0x0,(GLchar **)0x0,0,true);
    Utils::program::build
              (pppStack_18[2],(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               tesselation_evaluation_shader_code,(GLchar *)0x0,(GLchar *)0x0,(GLchar **)0x0,0,true)
    ;
    Utils::program::build
              (pppStack_18[3],(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               geometry_shader_code,(GLchar *)0x0,(GLchar **)0x0,0,true);
    Utils::program::build
              (pppStack_18[4],(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               tesselation_control_shader_code,(GLchar **)0x0,0,true);
  }
  for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
    GVar1 = Utils::program::getSubroutineIndex
                      (*pppStack_18,prepareProgram::subroutine_names[local_4c],0x8b30);
    this->m_subroutine_indices[local_4c].m_fragment_shader_stage = GVar1;
    GVar1 = Utils::program::getSubroutineIndex
                      (pppStack_18[1],prepareProgram::subroutine_names[local_4c],0x8dd9);
    this->m_subroutine_indices[local_4c].m_geometry_shader_stage = GVar1;
    GVar1 = Utils::program::getSubroutineIndex
                      (pppStack_18[2],prepareProgram::subroutine_names[local_4c],0x8e88);
    this->m_subroutine_indices[local_4c].m_tesselation_control_shader_stage = GVar1;
    GVar1 = Utils::program::getSubroutineIndex
                      (pppStack_18[3],prepareProgram::subroutine_names[local_4c],0x8e87);
    this->m_subroutine_indices[local_4c].m_tesselation_evaluation_shader_stage = GVar1;
    GVar1 = Utils::program::getSubroutineIndex
                      (pppStack_18[4],prepareProgram::subroutine_names[local_4c],0x8b31);
    this->m_subroutine_indices[local_4c].m_vertex_shader_stage = GVar1;
  }
  GVar1 = Utils::program::getSubroutineUniformLocation
                    (*pppStack_18,prepareProgram::subroutine_uniform_name,0x8b30);
  (this->m_subroutine_uniform_locations).m_fragment_shader_stage = GVar1;
  GVar1 = Utils::program::getSubroutineUniformLocation
                    (pppStack_18[1],prepareProgram::subroutine_uniform_name,0x8dd9);
  (this->m_subroutine_uniform_locations).m_geometry_shader_stage = GVar1;
  GVar1 = Utils::program::getSubroutineUniformLocation
                    (pppStack_18[2],prepareProgram::subroutine_uniform_name,0x8e88);
  (this->m_subroutine_uniform_locations).m_tesselation_control_shader_stage = GVar1;
  GVar1 = Utils::program::getSubroutineUniformLocation
                    (pppStack_18[3],prepareProgram::subroutine_uniform_name,0x8e87);
  (this->m_subroutine_uniform_locations).m_tesselation_evaluation_shader_stage = GVar1;
  GVar1 = Utils::program::getSubroutineUniformLocation
                    (pppStack_18[4],prepareProgram::subroutine_uniform_name,0x8b31);
  (this->m_subroutine_uniform_locations).m_vertex_shader_stage = GVar1;
  return;
}

Assistant:

void FunctionalTest20_21::prepareProgram(Utils::program** programs, bool is_separable)
{
	/* Get shader sources */
	const GLchar* vertex_shader_code;
	const GLchar* tesselation_control_shader_code;
	const GLchar* tesselation_evaluation_shader_code;
	const GLchar* geometry_shader_code;
	const GLchar* fragmenty_shader_code;

	getShaders(vertex_shader_code, tesselation_control_shader_code, tesselation_evaluation_shader_code,
			   geometry_shader_code, fragmenty_shader_code);

	/* Subroutines and uniform names */
	static const GLchar* subroutine_names[] = { "add", "multiply" };
	static const GLuint  n_subroutines		= sizeof(subroutine_names) / sizeof(subroutine_names[0]);

	static const GLchar* subroutine_uniform_name = "routine";

	/* Build program */
	if (false == is_separable)
	{
		programs[0]->build(0 /* compute shader source */, fragmenty_shader_code, geometry_shader_code,
						   tesselation_control_shader_code, tesselation_evaluation_shader_code, vertex_shader_code,
						   0 /* varying_names */, 0 /* n_varying_names */);

		programs[m_geometry_stage_index]			   = programs[m_fragment_stage_index];
		programs[m_tesselation_control_stage_index]	= programs[m_fragment_stage_index];
		programs[m_tesselation_evaluation_stage_index] = programs[m_fragment_stage_index];
		programs[m_vertex_stage_index]				   = programs[m_fragment_stage_index];
	}
	else
	{
		programs[m_fragment_stage_index]->build(0, fragmenty_shader_code, 0, 0, 0, 0, 0, 0, true);
		programs[m_geometry_stage_index]->build(0, 0, geometry_shader_code, 0, 0, 0, 0, 0, true);
		programs[m_tesselation_control_stage_index]->build(0, 0, 0, tesselation_control_shader_code, 0, 0, 0, 0, true);
		programs[m_tesselation_evaluation_stage_index]->build(0, 0, 0, 0, tesselation_evaluation_shader_code, 0, 0, 0,
															  true);
		programs[m_vertex_stage_index]->build(0, 0, 0, 0, 0, vertex_shader_code, 0, 0, true);
	}

	/* Get subroutine indices */
	for (GLuint i = 0; i < n_subroutines; ++i)
	{
		m_subroutine_indices[i].m_fragment_shader_stage =
			programs[m_fragment_stage_index]->getSubroutineIndex(subroutine_names[i], GL_FRAGMENT_SHADER);

		m_subroutine_indices[i].m_geometry_shader_stage =
			programs[m_geometry_stage_index]->getSubroutineIndex(subroutine_names[i], GL_GEOMETRY_SHADER);

		m_subroutine_indices[i].m_tesselation_control_shader_stage =
			programs[m_tesselation_control_stage_index]->getSubroutineIndex(subroutine_names[i],
																			GL_TESS_CONTROL_SHADER);

		m_subroutine_indices[i].m_tesselation_evaluation_shader_stage =
			programs[m_tesselation_evaluation_stage_index]->getSubroutineIndex(subroutine_names[i],
																			   GL_TESS_EVALUATION_SHADER);

		m_subroutine_indices[i].m_vertex_shader_stage =
			programs[m_vertex_stage_index]->getSubroutineIndex(subroutine_names[i], GL_VERTEX_SHADER);
	}

	/* Get subroutine uniform locations */
	m_subroutine_uniform_locations.m_fragment_shader_stage =
		programs[m_fragment_stage_index]->getSubroutineUniformLocation(subroutine_uniform_name, GL_FRAGMENT_SHADER);

	m_subroutine_uniform_locations.m_geometry_shader_stage =
		programs[m_geometry_stage_index]->getSubroutineUniformLocation(subroutine_uniform_name, GL_GEOMETRY_SHADER);

	m_subroutine_uniform_locations.m_tesselation_control_shader_stage =
		programs[m_tesselation_control_stage_index]->getSubroutineUniformLocation(subroutine_uniform_name,
																				  GL_TESS_CONTROL_SHADER);

	m_subroutine_uniform_locations.m_tesselation_evaluation_shader_stage =
		programs[m_tesselation_evaluation_stage_index]->getSubroutineUniformLocation(subroutine_uniform_name,
																					 GL_TESS_EVALUATION_SHADER);

	m_subroutine_uniform_locations.m_vertex_shader_stage =
		programs[m_vertex_stage_index]->getSubroutineUniformLocation(subroutine_uniform_name, GL_VERTEX_SHADER);
}